

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qnetworkrequest.cpp
# Opt level: O1

QHttpHeaders __thiscall
QNetworkHeadersPrivate::fromRawToHttp(QNetworkHeadersPrivate *this,RawHeadersList *raw)

{
  long lVar1;
  QAnyStringView name;
  QAnyStringView value;
  QAnyStringView name_00;
  int iVar2;
  pair<QByteArray,_QByteArray> *ppVar3;
  char *pcVar4;
  type *key;
  pair<QByteArray,_QByteArray> *ppVar5;
  long in_FS_OFFSET;
  QByteArrayView QVar6;
  QAnyStringView value_00;
  iterator __begin3;
  undefined1 local_98 [32];
  undefined1 *local_78;
  undefined1 *puStack_70;
  undefined1 *local_68;
  QStringTokenizerBase<QLatin1String,_QChar> local_58;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  if ((raw->d).size == 0) {
    if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
      QHttpHeaders::QHttpHeaders((QHttpHeaders *)this);
      return (QExplicitlySharedDataPointer<QHttpHeadersPrivate>)
             (QExplicitlySharedDataPointer<QHttpHeadersPrivate>)this;
    }
  }
  else {
    (this->rawHeaderCache).headersList.d.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
    QHttpHeaders::QHttpHeaders((QHttpHeaders *)this);
    QHttpHeaders::reserve((QHttpHeaders *)this,(raw->d).size);
    lVar1 = (raw->d).size;
    if (lVar1 != 0) {
      ppVar5 = (raw->d).ptr;
      ppVar3 = ppVar5 + lVar1;
      do {
        QVar6 = QHttpHeaders::wellKnownHeaderName(SetCookie);
        pcVar4 = (ppVar5->first).d.ptr;
        if (pcVar4 == (char *)0x0) {
          pcVar4 = (char *)&QByteArray::_empty;
        }
        iVar2 = qstrnicmp(pcVar4,(ppVar5->first).d.size,QVar6.m_data,QVar6.m_size);
        if (iVar2 == 0) {
          local_58.m_haystack.m_data = (ppVar5->second).d.ptr;
          local_58.m_haystack.m_size = (ppVar5->second).d.size;
          local_58.super_QStringTokenizerBaseBase.m_sb.
          super_QFlagsStorageHelper<Qt::SplitBehaviorFlags,_4>.
          super_QFlagsStorage<Qt::SplitBehaviorFlags>.i =
               (QFlagsStorageHelper<Qt::SplitBehaviorFlags,_4>)0x0;
          local_58.super_QStringTokenizerBaseBase.m_cs = CaseSensitive;
          local_58.m_needle.ucs = L'\n';
          local_68 = &DAT_aaaaaaaaaaaaaaaa;
          local_78 = &DAT_aaaaaaaaaaaaaaaa;
          puStack_70 = &DAT_aaaaaaaaaaaaaaaa;
          local_98._16_8_ = &DAT_aaaaaaaaaaaaaaaa;
          local_98._24_8_ = &DAT_aaaaaaaaaaaaaaaa;
          local_98._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
          local_98._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
          QStringTokenizerBase<QLatin1String,_QChar>::iterator::iterator
                    ((iterator *)local_98,&local_58);
          if (local_98[0x18] == true) {
            do {
              name_00.field_0 = (anon_union_8_3_8ad491a7_for_QAnyStringView_6)(ppVar5->first).d.ptr;
              name_00.m_size = (ppVar5->first).d.size;
              value_00.m_size = local_98._8_8_ | 0x4000000000000000;
              value_00.field_0.m_data = (void *)local_98._16_8_;
              QHttpHeaders::append((QHttpHeaders *)this,name_00,value_00);
              QStringTokenizerBase<QLatin1String,_QChar>::iterator::advance((iterator *)local_98);
            } while (local_98[0x18] != false);
          }
        }
        else {
          name.field_0 = (anon_union_8_3_8ad491a7_for_QAnyStringView_6)(ppVar5->first).d.ptr;
          name.m_size = (ppVar5->first).d.size;
          value.field_0 = (anon_union_8_3_8ad491a7_for_QAnyStringView_6)(ppVar5->second).d.ptr;
          value.m_size = (ppVar5->second).d.size;
          QHttpHeaders::append((QHttpHeaders *)this,name,value);
        }
        ppVar5 = ppVar5 + 1;
      } while (ppVar5 != ppVar3);
    }
    if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
      return (QExplicitlySharedDataPointer<QHttpHeadersPrivate>)
             (QExplicitlySharedDataPointer<QHttpHeadersPrivate>)this;
    }
  }
  __stack_chk_fail();
}

Assistant:

QHttpHeaders QNetworkHeadersPrivate::fromRawToHttp(const RawHeadersList &raw)
{
    if (raw.empty())
        return {};

    QHttpHeaders headers;
    headers.reserve(raw.size());

    for (const auto &[key, value] : raw) {
        const bool isSetCookie = key.compare(QHttpHeaders::wellKnownHeaderName(
                                             QHttpHeaders::WellKnownHeader::SetCookie),
                                             Qt::CaseInsensitive) == 0;
        if (isSetCookie) {
            for (auto header : QLatin1StringView(value).tokenize('\n'_L1))
                headers.append(key, header);
        } else {
            headers.append(key, value);
        }
    }

    return headers;
}